

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

wchar_t la_mktemp(archive_write_disk *a)

{
  char *template;
  wchar_t __fd;
  int iVar1;
  int *piVar2;
  wchar_t wVar3;
  
  (a->_tmpname_data).length = 0;
  archive_string_sprintf(&a->_tmpname_data,"%s.XXXXXX",a->name);
  template = (a->_tmpname_data).s;
  a->tmpname = template;
  __fd = __archive_mkstemp(template);
  wVar3 = L'\xffffffff';
  if ((__fd != L'\xffffffff') &&
     (iVar1 = fchmod(__fd,~a->user_umask & a->mode & 0x1ff), wVar3 = __fd, iVar1 == -1)) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    close(__fd);
    *piVar2 = iVar1;
    wVar3 = L'\xffffffff';
  }
  return wVar3;
}

Assistant:

static int
la_mktemp(struct archive_write_disk *a)
{
	int oerrno, fd;
	mode_t mode;

	archive_string_empty(&a->_tmpname_data);
	archive_string_sprintf(&a->_tmpname_data, "%s.XXXXXX", a->name);
	a->tmpname = a->_tmpname_data.s;

	fd = __archive_mkstemp(a->tmpname);
	if (fd == -1)
		return -1;

	mode = a->mode & 0777 & ~a->user_umask;
	if (fchmod(fd, mode) == -1) {
		oerrno = errno;
		close(fd);
		errno = oerrno;
		return -1;
	}
	return fd;
}